

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O0

size_t vsosc_null(char *address,char *arguments,rtosc_arg_t *args)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  long in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *s;
  int i;
  char arg;
  uint arg_pos;
  uint toparse;
  uint pos;
  char *in_stack_ffffffffffffffc0;
  uint local_24;
  uint local_20;
  uint local_1c;
  char *local_10;
  
  sVar1 = strlen(in_RDI);
  sVar2 = strlen(in_RSI);
  local_1c = ((uint)sVar1 - ((uint)sVar1 & 3)) + (int)sVar2 + 5;
  local_1c = (4 - (local_1c & 3)) + local_1c;
  local_20 = nreserved(in_stack_ffffffffffffffc0);
  local_24 = 0;
  local_10 = in_RSI;
  while (local_20 != 0) {
    pcVar3 = local_10 + 1;
    switch(*local_10) {
    case 'S':
    case 's':
      sVar1 = strlen(*(char **)(in_RDX + (ulong)local_24 * 0x10));
      local_1c = local_1c + (int)sVar1;
      local_1c = (4 - (local_1c & 3)) + local_1c;
      local_20 = local_20 - 1;
      local_24 = local_24 + 1;
      local_10 = pcVar3;
      break;
    default:
      local_10 = pcVar3;
      break;
    case 'b':
      local_1c = *(int *)(in_RDX + (ulong)local_24 * 0x10) + 4 + local_1c;
      if ((local_1c & 3) != 0) {
        local_1c = (4 - (local_1c & 3)) + local_1c;
      }
      local_20 = local_20 - 1;
      local_24 = local_24 + 1;
      local_10 = pcVar3;
      break;
    case 'c':
    case 'f':
    case 'i':
    case 'm':
    case 'r':
      local_1c = local_1c + 4;
      local_20 = local_20 - 1;
      local_24 = local_24 + 1;
      local_10 = pcVar3;
      break;
    case 'd':
    case 'h':
    case 't':
      local_1c = local_1c + 8;
      local_20 = local_20 - 1;
      local_24 = local_24 + 1;
      local_10 = pcVar3;
    }
  }
  return (ulong)local_1c;
}

Assistant:

static size_t vsosc_null(const char        *address,
                         const char        *arguments,
                         const rtosc_arg_t *args)
{
    unsigned pos = 0;
    pos += strlen(address);
    pos += 4-pos%4;//get 32 bit alignment
    pos += 1+strlen(arguments);
    pos += 4-pos%4;

    unsigned toparse = nreserved(arguments);
    unsigned arg_pos = 0;

    //Take care of varargs
    while(toparse)
    {
        char arg = *arguments++;
        assert(arg);
        int i;
        const char *s;
        switch(arg) {
            case 'h':
            case 't':
            case 'd':
                ++arg_pos;
                pos += 8;
                --toparse;
                break;
            case 'm':
            case 'r':
            case 'c':
            case 'f':
            case 'i':
                ++arg_pos;
                pos += 4;
                --toparse;
                break;
            case 's':
            case 'S':
                s = args[arg_pos++].s;
                assert(s && "Input strings CANNOT be NULL");
                pos += strlen(s);
                pos += 4-pos%4;
                --toparse;
                break;
            case 'b':
                i = args[arg_pos++].b.len;
                pos += 4 + i;
                if(pos%4)
                    pos += 4-pos%4;
                --toparse;
                break;
            default:
                ;
        }
    }

    return pos;
}